

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CAdES.h
# Opt level: O2

size_t __thiscall Holder::SetDataSize(Holder *this)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  
  sVar1 = DerBase::EncodedSize(&(this->baseCertificateID).super_DerBase);
  sVar2 = DerBase::EncodedSize(&(this->entityName).super_DerBase);
  sVar3 = DerBase::EncodedSize(&(this->objectDigestInfo).super_DerBase);
  sVar3 = sVar3 + sVar2 + sVar1;
  (this->super_DerBase).cbData = sVar3;
  return sVar3;
}

Assistant:

virtual size_t SetDataSize() override
	{
		cbData = baseCertificateID.EncodedSize() + entityName.EncodedSize() + objectDigestInfo.EncodedSize();
		return cbData;
	}